

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_avx2.c
# Opt level: O0

void cfl_luma_subsampling_444_lbd_avx2
               (uint8_t *input,int input_stride,uint16_t *pred_buf_q3,int width,int height)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined8 *in_RDX;
  int in_ESI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  __m256i row_hi;
  __m256i row_lo;
  __m256i top;
  __m256i zeros;
  __m256i *row_end;
  __m256i *row;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 *local_210;
  undefined1 (*local_1f0) [32];
  
  local_210 = in_RDX;
  local_1f0 = in_RDI;
  do {
    auVar2 = vpermq_avx2(*local_1f0,0xd8);
    auVar1 = vpunpcklbw_avx2(auVar2,ZEXT1632(ZEXT816(0)));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(3));
    auVar2 = vpunpckhbw_avx2(auVar2,ZEXT1632(ZEXT816(0)));
    auVar2 = vpsllw_avx2(auVar2,ZEXT416(3));
    local_280 = auVar1._0_8_;
    uStack_278 = auVar1._8_8_;
    uStack_270 = auVar1._16_8_;
    uStack_268 = auVar1._24_8_;
    *local_210 = local_280;
    local_210[1] = uStack_278;
    local_210[2] = uStack_270;
    local_210[3] = uStack_268;
    local_2a0 = auVar2._0_8_;
    uStack_298 = auVar2._8_8_;
    uStack_290 = auVar2._16_8_;
    uStack_288 = auVar2._24_8_;
    local_210[4] = local_2a0;
    local_210[5] = uStack_298;
    local_210[6] = uStack_290;
    local_210[7] = uStack_288;
    local_1f0 = (undefined1 (*) [32])(*local_1f0 + in_ESI);
    local_210 = local_210 + 8;
  } while (local_210 < in_RDX + (long)(in_R8D * 2) * 4);
  return;
}

Assistant:

static void cfl_luma_subsampling_444_lbd_avx2(const uint8_t *input,
                                              int input_stride,
                                              uint16_t *pred_buf_q3, int width,
                                              int height) {
  (void)width;  // Forever 32
  __m256i *row = (__m256i *)pred_buf_q3;
  const __m256i *row_end = row + height * CFL_BUF_LINE_I256;
  const __m256i zeros = _mm256_setzero_si256();
  do {
    __m256i top = _mm256_loadu_si256((__m256i *)input);
    top = _mm256_permute4x64_epi64(top, _MM_SHUFFLE(3, 1, 2, 0));

    __m256i row_lo = _mm256_unpacklo_epi8(top, zeros);
    row_lo = _mm256_slli_epi16(row_lo, 3);
    __m256i row_hi = _mm256_unpackhi_epi8(top, zeros);
    row_hi = _mm256_slli_epi16(row_hi, 3);

    _mm256_storeu_si256(row, row_lo);
    _mm256_storeu_si256(row + 1, row_hi);

    input += input_stride;
  } while ((row += CFL_BUF_LINE_I256) < row_end);
}